

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Memory_Banks.c
# Opt level: O0

void gb_common_writes(MemoryBankController *mc,uint16_t address,uint8_t data)

{
  uint8_t data_local;
  uint16_t address_local;
  MemoryBankController *mc_local;
  
  if (address < 0x2000) {
    mc->ram_enabled = (data & 0xf) == 10;
  }
  else if ((address < 0xfea0) || (0xfefe < address)) {
    if (address == 0xff04) {
      mc->memory[0xff04] = '\0';
      mc->div_register = 0;
    }
    else if (address == 0xff44) {
      mc->memory[0xff44] = '\0';
    }
    else if (address == 0xff46) {
      gb_dma_transfer(mc,data);
    }
    else {
      mc->memory[address] = data;
    }
  }
  return;
}

Assistant:

void gb_common_writes(MemoryBankController* mc, uint16_t address, uint8_t data) {
    
    if(address <= 0x1FFF) {
        mc->ram_enabled = ((data & 0x0F) == 0x0A);
        return;
    }

    if (address >= 0xFEA0 && address < 0xFEFF) {
        return;
    }

    switch (address) {
    case DIV:
        mc->memory[address] = 0;
        mc->div_register = 0;
        break;
    case DMA:
        gb_dma_transfer(mc, data);
        break;
    case LY:
        mc->memory[address] = 0;
        break;
    default:
        mc->memory[address] = data;
        break;
    }
}